

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Manifold.cpp
# Opt level: O0

void __thiscall
mnf::Manifold::applyDiffRetractation(Manifold *this,RefMat *out,ConstRefMat *in,ConstRefVec *x)

{
  bool bVar1;
  Index IVar2;
  Index IVar3;
  Index IVar4;
  bool local_51;
  Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_> local_50;
  ConstRefVec *local_28;
  ConstRefVec *x_local;
  ConstRefMat *in_local;
  RefMat *out_local;
  Manifold *this_local;
  
  local_28 = x;
  x_local = (ConstRefVec *)in;
  in_local = (ConstRefMat *)out;
  out_local = (RefMat *)this;
  bVar1 = ValidManifold::isValid(&this->super_ValidManifold);
  local_51 = true;
  if (!bVar1) {
    local_51 = ValidManifold::seeMessageAbove(&this->super_ValidManifold);
  }
  if (local_51 == false) {
    __assert_fail("isValid() || seeMessageAbove()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/src/Manifold.cpp"
                  ,0xd7,
                  "void mnf::Manifold::applyDiffRetractation(RefMat, const ConstRefMat &, const ConstRefVec &) const"
                 );
  }
  IVar2 = Eigen::
          MapBase<Eigen::Ref<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_0>
          ::cols((MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                  *)x_local);
  if (IVar2 != this->representationDim_) {
    __assert_fail("in.cols() == representationDim_",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/src/Manifold.cpp"
                  ,0xd8,
                  "void mnf::Manifold::applyDiffRetractation(RefMat, const ConstRefMat &, const ConstRefVec &) const"
                 );
  }
  IVar2 = Eigen::
          MapBase<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_0>
          ::cols((MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                  *)out);
  if (IVar2 == this->tangentDim_) {
    IVar2 = Eigen::
            MapBase<Eigen::Ref<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_0>
            ::rows((MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                    *)x_local);
    IVar3 = Eigen::
            MapBase<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_0>
            ::rows((MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                    *)out);
    if (IVar2 != IVar3) {
      __assert_fail("in.rows() == out.rows()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/src/Manifold.cpp"
                    ,0xda,
                    "void mnf::Manifold::applyDiffRetractation(RefMat, const ConstRefMat &, const ConstRefVec &) const"
                   );
    }
    IVar4 = Eigen::
            EigenBase<Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>_>
            ::size((EigenBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                    *)local_28);
    if (IVar4 == this->representationDim_) {
      Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>::Ref
                (&local_50,out);
      (*this->_vptr_Manifold[0x17])(this,&local_50,x_local,local_28);
      return;
    }
    __assert_fail("x.size() == representationDim_",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/src/Manifold.cpp"
                  ,0xdb,
                  "void mnf::Manifold::applyDiffRetractation(RefMat, const ConstRefMat &, const ConstRefVec &) const"
                 );
  }
  __assert_fail("out.cols() == tangentDim_",
                "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/src/Manifold.cpp"
                ,0xd9,
                "void mnf::Manifold::applyDiffRetractation(RefMat, const ConstRefMat &, const ConstRefVec &) const"
               );
}

Assistant:

void Manifold::applyDiffRetractation(RefMat out, const ConstRefMat& in,
                                     const ConstRefVec& x) const
{
  mnf_assert(isValid() || seeMessageAbove());
  mnf_assert(in.cols() == representationDim_);
  mnf_assert(out.cols() == tangentDim_);
  mnf_assert(in.rows() == out.rows());
  mnf_assert(x.size() == representationDim_);
  applyDiffRetractation_(out, in, x);
}